

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O1

void mdiffwrite(memfile *mf,void *buf,uint bytes)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  
  uVar2 = mf->diffpos + bytes;
  uVar1 = mf->difflen;
  uVar4 = uVar1;
  if (uVar1 < uVar2) {
    uVar4 = uVar1 + 0x1000;
    if (uVar1 + 0x1000 < uVar2) {
      uVar4 = uVar2;
    }
    uVar4 = uVar1 + (~uVar1 + uVar4 & 0xfffff000) + 0x1000;
    mf->difflen = uVar4;
  }
  if (uVar1 < uVar2) {
    pcVar3 = (char *)realloc(mf->diffbuf,(long)(int)uVar4);
    mf->diffbuf = pcVar3;
  }
  memcpy(mf->diffbuf + mf->diffpos,buf,(ulong)bytes);
  mf->diffpos = mf->diffpos + bytes;
  return;
}

Assistant:

static void mdiffwrite(struct memfile *mf, const void *buf, unsigned int bytes)
{
	boolean do_realloc = FALSE;
	while (mf->difflen < mf->diffpos + bytes) {
	    mf->difflen += 4096;
	    do_realloc = TRUE;
	}

	if (do_realloc)
	    mf->diffbuf = realloc(mf->diffbuf, mf->difflen);
	memcpy(&mf->diffbuf[mf->diffpos], buf, bytes);
	mf->diffpos += bytes;
}